

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

test_call_type *
dispatch_parameters<unsigned_long>
          (test_call_type *__return_storage_ptr__,string *statistic,string *prepare_type)

{
  prepare_function_for_t<unsigned_long> prepare_funcion;
  statistic_function_for_t<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  statistic_function;
  _Any_data local_90;
  _Manager_type local_80;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((statistic_function_for_t<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *
             )&local_30,statistic);
  prepare_for<unsigned_long>((prepare_function_for_t<unsigned_long> *)&local_50,prepare_type);
  std::
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  ::function((function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
              *)&local_70,
             (function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
              *)&local_30);
  std::
  function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
  ::function((function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
              *)&local_90,
             (function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
              *)&local_50);
  make_test_all<unsigned_long,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_long,std::allocator<unsigned_long>>(std::vector<unsigned_long,std::allocator<unsigned_long>>)>>
            (__return_storage_ptr__,
             (function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
              *)&local_70,
             (function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
              *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

test_call_type dispatch_parameters (const std::string & statistic, const std::string & prepare_type)
{
    auto statistic_function = statistic_for<clock_type::duration>(statistic);
    auto prepare_funcion = prepare_for<Value>(prepare_type);

    return make_test_all<Value>(statistic_function, prepare_funcion);
}